

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O1

bool draco::WriteBufferToFile(char *buffer,size_t buffer_size,string *file_name)

{
  undefined1 uVar1;
  unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
  file_writer;
  _Alloc_hider local_20;
  
  FileWriterFactory::OpenWriter((string *)&local_20);
  if ((long *)local_20._M_p == (long *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = (**(code **)(*(long *)local_20._M_p + 0x10))(local_20._M_p,buffer,buffer_size);
  }
  if ((long *)local_20._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_20._M_p + 8))();
  }
  return (bool)uVar1;
}

Assistant:

bool WriteBufferToFile(const char *buffer, size_t buffer_size,
                       const std::string &file_name) {
  std::unique_ptr<FileWriterInterface> file_writer =
      FileWriterFactory::OpenWriter(file_name);
  if (file_writer == nullptr) {
    return false;
  }
  return file_writer->Write(buffer, buffer_size);
}